

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_request(http_s *request)

{
  FIOBJ FVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  lua_State *L_00;
  char *__s;
  char *__s_00;
  FIOBJ FVar5;
  char *result;
  char *mime;
  lua_State *L;
  stat path_stat;
  char luaPath [256];
  fio_str_info_s local_30;
  char *local_18;
  char *path;
  http_s *request_local;
  
  path = (char *)request;
  llog_trace("Check path");
  fiobj_obj2cstr(&local_30,*(FIOBJ *)(path + 0x48));
  local_18 = local_30.data;
  sVar4 = strlen(local_30.data);
  if (sVar4 < 0x100) {
    memset(path_stat.__glibc_reserved + 2,0,0x100);
    iVar3 = strcmp(local_18,"/");
    if (iVar3 == 0) {
      snprintf((char *)(path_stat.__glibc_reserved + 2),0x100,"pages/index.lua");
    }
    else {
      snprintf((char *)(path_stat.__glibc_reserved + 2),0x100,"%s%s%s","pages",local_18,".lua");
    }
    llog_trace((char *)(path_stat.__glibc_reserved + 2));
    llog_trace("Check exists");
    iVar3 = access((char *)(path_stat.__glibc_reserved + 2),0);
    if (iVar3 == -1) {
      http_send_error((http_s *)path,0x194);
    }
    else {
      stat((char *)(path_stat.__glibc_reserved + 2),(stat *)&L);
      if (((uint)path_stat.st_nlink & 0xf000) == 0x8000) {
        llog_trace("Init Lua");
        L_00 = luaL_newstate();
        luaL_openlibs(L_00);
        llog_trace("Run file");
        iVar3 = luaL_loadfilex(L_00,(char *)(path_stat.__glibc_reserved + 2),(char *)0x0);
        if (iVar3 == 0) {
          lua_pcallk(L_00,0,-1,0,0,(lua_KFunction)0x0);
        }
        llog_trace("Run func");
        lua_getglobal(L_00,"doPage");
        lua_callk(L_00,0,2,0,(lua_KFunction)0x0);
        llog_trace("Parse returns");
        __s = lua_tolstring(L_00,-1,(size_t *)0x0);
        __s_00 = lua_tolstring(L_00,-2,(size_t *)0x0);
        lua_settop(L_00,-3);
        llog_trace("Cleanup Lua");
        lua_close(L_00);
        llog_trace("Return results");
        pcVar2 = path;
        FVar1 = HTTP_HEADER_CONTENT_TYPE;
        sVar4 = strlen(__s);
        FVar5 = http_mimetype_find(__s,sVar4);
        http_set_header((http_s *)pcVar2,FVar1,FVar5);
        pcVar2 = path;
        FVar1 = HTTP_HEADER_SERVER;
        FVar5 = fiobj_dup(HTTP_HEADER_SERVER_VALUE);
        http_set_header((http_s *)pcVar2,FVar1,FVar5);
        pcVar2 = path;
        sVar4 = strlen(__s_00);
        http_send_body((http_s *)pcVar2,__s_00,sVar4);
      }
      else {
        http_send_error((http_s *)path,0x194);
      }
    }
  }
  else {
    http_send_error((http_s *)path,500);
  }
  return;
}

Assistant:

void on_request(http_s *request) {
    // Generate the path to the Lua file to handle our request
    llog_trace("Check path");
    // TODO: sanatise path (make sure it doesn't escape the pages folder, etc)
    char* path = fiobj_obj2cstr(request->path).data;
    // The actual max path is MAX_LENGTH-1 (ex. 256-1), since it needs to be null terminated
    // TODO: take into account "pages" and ".lua"
    if(strlen(path) > PATH_MAX_LEN - 1) {
        http_send_error(request, 500);
        return;
    }
    char luaPath[PATH_MAX_LEN];
    memset(luaPath, 0, sizeof(luaPath));
    if (strcmp(path, "/") == 0) {
        // sizeof is useful here because we do want to include the null
        // character in the length
        snprintf(luaPath, sizeof(luaPath), "pages/index.lua");
    } else {
        // Combine "pages", path, and ".lua" to create our target path
        // The path variable should always start with a /
        snprintf(luaPath, sizeof(luaPath), "%s%s%s", "pages", path, ".lua");
    }
    llog_trace(luaPath);

    // Check if the Lua file does not exist
    llog_trace("Check exists");
    if (access(luaPath, F_OK) == -1) {
        http_send_error(request, 404);
        return;
    }

     // Check if it's actually a file, not a folder
    struct stat path_stat;
    stat(luaPath, &path_stat);
    if (!S_ISREG(path_stat.st_mode)) {
        http_send_error(request, 404);
        return;
    }

    // Initialise a Lua interpreter
    llog_trace("Init Lua");
    lua_State* L = luaL_newstate();
    luaL_openlibs(L);

    // Import the file
    llog_trace("Run file");
    luaL_dofile(L, luaPath);

    // Run the doPage() function
    llog_trace("Run func");
    lua_getglobal(L, "doPage");
    lua_call(L, 0, 2);

    // Get the returning strings
    llog_trace("Parse returns");
    char* mime = (char*)lua_tostring(L, -1);
    char* result = (char*)lua_tostring(L, -2);
    lua_pop(L, 2);

    // Close the Lua interpreter session
    llog_trace("Cleanup Lua");
    lua_close(L);

    // Send result to client
    llog_trace("Return results");
    http_set_header(request, HTTP_HEADER_CONTENT_TYPE, http_mimetype_find(mime, strlen(mime)));
    // TODO: not run fiobj_str_new every request for a static header
    http_set_header(
        request, 
        HTTP_HEADER_SERVER, 
        fiobj_dup(HTTP_HEADER_SERVER_VALUE)
    );
    http_send_body(request, result, strlen(result));
}